

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_rea.c
# Opt level: O2

size_t tool_read_cb(char *buffer,size_t sz,size_t nmemb,void *userdata)

{
  long lVar1;
  uint __i;
  int iVar2;
  timediff_t tVar3;
  long lVar4;
  size_t sVar5;
  int *piVar6;
  curltime cVar7;
  curltime newer;
  timeval timeout;
  fd_set bits;
  
  lVar1 = *(long *)((long)userdata + 0x10);
  if ((*(long *)((long)userdata + 0x1b0) == -1) ||
     (*(long *)((long)userdata + 0x1b8) != *(long *)((long)userdata + 0x1b0))) {
    if (*(long *)(lVar1 + 0x438) != 0) {
      cVar7 = curlx_now();
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar7._0_12_,0);
      newer.tv_usec = SUB124(cVar7._0_12_,8);
      cVar7._12_4_ = 0;
      cVar7._0_12_ = *(undefined1 (*) [12])((long)userdata + 0x48);
      tVar3 = curlx_timediff(newer,cVar7);
      lVar4 = *(long *)(lVar1 + 0x438) - tVar3;
      if (*(long *)(lVar1 + 0x438) < tVar3) goto LAB_0010bf09;
      timeout.tv_sec = lVar4 / 1000;
      timeout.tv_usec = (lVar4 % 1000) * 1000;
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        bits.fds_bits[lVar4] = 0;
      }
      iVar2 = *(int *)((long)userdata + 0x80);
      bits.fds_bits[iVar2 / 0x40] = bits.fds_bits[iVar2 / 0x40] | 1L << ((byte)iVar2 & 0x3f);
      iVar2 = select(iVar2 + 1,(fd_set *)&bits,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&timeout);
      if (iVar2 == 0) {
        return 0;
      }
    }
    sVar5 = read(*(int *)((long)userdata + 0x80),buffer,nmemb * sz);
    if ((long)sVar5 < 0) {
      piVar6 = __errno_location();
      if (*piVar6 == 0xb) {
        *piVar6 = 0;
        *(byte *)(lVar1 + 0x4d7) = *(byte *)(lVar1 + 0x4d7) | 0x20;
        return 0x10000001;
      }
      sVar5 = 0;
    }
    if ((*(long *)((long)userdata + 0x1b0) != -1) &&
       (*(long *)((long)userdata + 0x1b0) < (long)(*(long *)((long)userdata + 0x1b8) + sVar5))) {
      warnf(*(GlobalConfig **)(*(long *)((long)userdata + 0x10) + 0x3a8),
            "File size larger in the end than when started. Dropping at least %ld bytes");
      sVar5 = *(long *)((long)userdata + 0x1b0) - *(long *)((long)userdata + 0x1b8);
    }
    *(byte *)(lVar1 + 0x4d7) = *(byte *)(lVar1 + 0x4d7) & 0xdf;
  }
  else {
LAB_0010bf09:
    sVar5 = 0;
  }
  return sVar5;
}

Assistant:

size_t tool_read_cb(char *buffer, size_t sz, size_t nmemb, void *userdata)
{
  ssize_t rc = 0;
  struct per_transfer *per = userdata;
  struct OperationConfig *config = per->config;

  if((per->uploadfilesize != -1) &&
     (per->uploadedsofar == per->uploadfilesize)) {
    /* done */
    return 0;
  }

  if(config->timeout_ms) {
    struct curltime now = curlx_now();
    long msdelta = (long)curlx_timediff(now, per->start);

    if(msdelta > config->timeout_ms)
      /* timeout */
      return 0;
#ifndef _WIN32
    /* this logic waits on read activity on a file descriptor that is not a
       socket which makes it not work with select() on Windows */
    else {
      fd_set bits;
      struct timeval timeout;
      long wait = config->timeout_ms - msdelta;

      /* wait this long at the most */
      timeout.tv_sec = wait/1000;
      timeout.tv_usec = (int)((wait%1000)*1000);

      FD_ZERO(&bits);
#if defined(__DJGPP__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warith-conversion"
#endif
      FD_SET(per->infd, &bits);
#if defined(__DJGPP__)
#pragma GCC diagnostic pop
#endif
      if(!select(per->infd + 1, &bits, NULL, NULL, &timeout))
        return 0; /* timeout */
    }
#endif
  }

  rc = read(per->infd, buffer, sz*nmemb);
  if(rc < 0) {
    if(errno == EAGAIN) {
      CURL_SETERRNO(0);
      config->readbusy = TRUE;
      return CURL_READFUNC_PAUSE;
    }
    /* since size_t is unsigned we cannot return negative values fine */
    rc = 0;
  }
  if((per->uploadfilesize != -1) &&
     (per->uploadedsofar + rc > per->uploadfilesize)) {
    /* do not allow uploading more than originally set out to do */
    curl_off_t delta = per->uploadedsofar + rc - per->uploadfilesize;
    warnf(per->config->global, "File size larger in the end than when "
          "started. Dropping at least %" CURL_FORMAT_CURL_OFF_T " bytes",
          delta);
    rc = (ssize_t)(per->uploadfilesize - per->uploadedsofar);
  }
  config->readbusy = FALSE;

  /* when select() returned zero here, it timed out */
  return (size_t)rc;
}